

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O1

FT_Error FT_GlyphLoader_CheckSubGlyphs(FT_GlyphLoader loader,FT_UInt n_subs)

{
  FT_SubGlyph pFVar1;
  uint uVar2;
  FT_Error error;
  FT_Error local_1c;
  
  local_1c = 0;
  uVar2 = n_subs + (loader->base).num_subglyphs + (loader->current).num_subglyphs;
  if (loader->max_subglyphs < uVar2) {
    uVar2 = uVar2 + 1 & 0xfffffffe;
    pFVar1 = (FT_SubGlyph)
             ft_mem_realloc(loader->memory,0x30,(ulong)loader->max_subglyphs,(ulong)uVar2,
                            (loader->base).subglyphs,&local_1c);
    (loader->base).subglyphs = pFVar1;
    if (local_1c == 0) {
      loader->max_subglyphs = uVar2;
      (loader->current).subglyphs = pFVar1 + (loader->base).num_subglyphs;
    }
  }
  return local_1c;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckSubGlyphs( FT_GlyphLoader  loader,
                                 FT_UInt         n_subs )
  {
    FT_Memory     memory = loader->memory;
    FT_Error      error  = FT_Err_Ok;
    FT_UInt       new_max, old_max;

    FT_GlyphLoad  base    = &loader->base;
    FT_GlyphLoad  current = &loader->current;


    new_max = base->num_subglyphs + current->num_subglyphs + n_subs;
    old_max = loader->max_subglyphs;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 2 );
      if ( FT_RENEW_ARRAY( base->subglyphs, old_max, new_max ) )
        goto Exit;

      loader->max_subglyphs = new_max;

      FT_GlyphLoader_Adjust_Subglyphs( loader );
    }

  Exit:
    return error;
  }